

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAbbreviationDeclaration.cpp
# Opt level: O3

Optional<llvm::DWARFFormValue> * __thiscall
llvm::DWARFAbbreviationDeclaration::getAttributeValue
          (Optional<llvm::DWARFFormValue> *__return_storage_ptr__,DWARFAbbreviationDeclaration *this
          ,uint64_t DIEOffset,Attribute Attr,DWARFUnit *U)

{
  DataExtractor DebugInfoData_00;
  bool bVar1;
  ulong uVar2;
  Attribute *pAVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  AttributeSpec *this_00;
  Optional<long> OVar7;
  undefined1 auStack_90 [8];
  DWARFDataExtractor DebugInfoData;
  DWARFFormValue FormValue;
  uint64_t Offset;
  
  uVar2 = (ulong)(this->AttributeSpecs).
                 super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                 super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                 .
                 super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                 .super_SmallVectorBase.Size;
  if (uVar2 != 0) {
    pAVar3 = (Attribute *)
             (this->AttributeSpecs).
             super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
             super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>.
             super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
             .super_SmallVectorBase.BeginX;
    uVar6 = 0;
    do {
      if (*pAVar3 == Attr) {
        DWARFUnit::getDebugInfoExtractor((DWARFDataExtractor *)auStack_90,U);
        FormValue.C = (DWARFContext *)(this->CodeByteSize + DIEOffset);
        uVar2 = (ulong)(this->AttributeSpecs).
                       super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                       super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                       .
                       super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                       .super_SmallVectorBase.Size;
        if (uVar2 != 0) {
          this_00 = (AttributeSpec *)
                    (this->AttributeSpecs).
                    super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                    super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                    .
                    super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                    .super_SmallVectorBase.BeginX;
          lVar4 = uVar2 << 4;
          goto LAB_00ad350c;
        }
        break;
      }
      uVar6 = uVar6 + 1;
      pAVar3 = pAVar3 + 8;
    } while (uVar2 != uVar6);
  }
  goto LAB_00ad359f;
  while( true ) {
    OVar7 = AttributeSpec::getByteSize(this_00,U);
    if (((undefined1  [16])OVar7.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      DebugInfoData_00.Data.Length = (size_t)DebugInfoData.super_DataExtractor.Data.Data;
      DebugInfoData_00.Data.Data = (char *)auStack_90;
      DebugInfoData_00.IsLittleEndian = (undefined1)DebugInfoData.super_DataExtractor.Data.Length;
      DebugInfoData_00.AddressSize = DebugInfoData.super_DataExtractor.Data.Length._1_1_;
      DebugInfoData_00._18_6_ = DebugInfoData.super_DataExtractor.Data.Length._2_6_;
      DWARFFormValue::skipValue
                (this_00->Form,DebugInfoData_00,(uint64_t *)&FormValue.C,(U->Header).FormParams);
    }
    else {
      FormValue.C = (DWARFContext *)
                    ((long)(&((FormValue.C)->NormalUnits).
                             super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                             .
                             super_SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                           + -4) + OVar7.Storage.field_0.value);
    }
    this_00 = this_00 + 1;
    lVar4 = lVar4 + -0x10;
    if (lVar4 == 0) break;
LAB_00ad350c:
    iVar5 = (int)uVar6;
    uVar6 = (ulong)(iVar5 - 1);
    if (iVar5 == 0) {
      if (this_00->Form == DW_FORM_implicit_const) {
        DWARFFormValue::createFromSValue(DW_FORM_implicit_const,(this_00->field_2).Value);
LAB_00ad35e2:
        (__return_storage_ptr__->Storage).hasVal = true;
        return __return_storage_ptr__;
      }
      FormValue.Form = 0;
      FormValue._2_6_ = 0;
      FormValue.Value.field_0.uval = 0;
      FormValue.Value.SectionIndex = 0;
      FormValue.U = (DWARFUnit *)0x0;
      DebugInfoData.Section._0_2_ = this_00->Form;
      bVar1 = DWARFFormValue::extractValue
                        ((DWARFFormValue *)&DebugInfoData.Section,(DWARFDataExtractor *)auStack_90,
                         (uint64_t *)&FormValue.C,(U->Header).FormParams,(DWARFContext *)0x0,U);
      if (bVar1) {
        (__return_storage_ptr__->Storage).field_0.value.U =
             (DWARFUnit *)FormValue.Value.SectionIndex;
        (__return_storage_ptr__->Storage).field_0.value.C = (DWARFContext *)FormValue.U;
        (__return_storage_ptr__->Storage).field_0.value.Value.data =
             (uint8_t *)FormValue.Value.field_0;
        (__return_storage_ptr__->Storage).field_0.value.Value.SectionIndex =
             (uint64_t)FormValue.Value.data;
        *(ulong *)&(__return_storage_ptr__->Storage).field_0 =
             CONCAT62(DebugInfoData.Section._2_6_,(Form)DebugInfoData.Section);
        (__return_storage_ptr__->Storage).field_0.value.Value.field_0 =
             (anon_union_8_3_82d75f4a_for_ValueType_0)FormValue._0_8_;
        goto LAB_00ad35e2;
      }
    }
  }
LAB_00ad359f:
  (__return_storage_ptr__->Storage).field_0.empty = '\0';
  (__return_storage_ptr__->Storage).hasVal = false;
  return __return_storage_ptr__;
}

Assistant:

Optional<DWARFFormValue> DWARFAbbreviationDeclaration::getAttributeValue(
    const uint64_t DIEOffset, const dwarf::Attribute Attr,
    const DWARFUnit &U) const {
  Optional<uint32_t> MatchAttrIndex = findAttributeIndex(Attr);
  if (!MatchAttrIndex)
    return None;

  auto DebugInfoData = U.getDebugInfoExtractor();

  // Add the byte size of ULEB that for the abbrev Code so we can start
  // skipping the attribute data.
  uint64_t Offset = DIEOffset + CodeByteSize;
  uint32_t AttrIndex = 0;
  for (const auto &Spec : AttributeSpecs) {
    if (*MatchAttrIndex == AttrIndex) {
      // We have arrived at the attribute to extract, extract if from Offset.
      if (Spec.isImplicitConst())
        return DWARFFormValue::createFromSValue(Spec.Form,
                                                Spec.getImplicitConstValue());

      DWARFFormValue FormValue(Spec.Form);
      if (FormValue.extractValue(DebugInfoData, &Offset, U.getFormParams(), &U))
        return FormValue;
    }
    // March Offset along until we get to the attribute we want.
    if (auto FixedSize = Spec.getByteSize(U))
      Offset += *FixedSize;
    else
      DWARFFormValue::skipValue(Spec.Form, DebugInfoData, &Offset,
                                U.getFormParams());
    ++AttrIndex;
  }
  return None;
}